

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O1

StringPiece muduo::ProcessInfo::procname(string *stat)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  StringPiece SVar5;
  
  uVar2 = std::__cxx11::string::find((char)stat,0x28);
  uVar3 = std::__cxx11::string::rfind((char)stat,0x29);
  pcVar4 = (stat->_M_dataplus)._M_p + uVar2 + 1;
  pcVar1 = (pointer)(ulong)(~(uint)uVar2 + (int)uVar3);
  if (uVar3 <= uVar2 || uVar3 == 0xffffffffffffffff) {
    pcVar4 = (pointer)0x0;
    pcVar1 = (pointer)0x0;
  }
  SVar5._8_8_ = pcVar1;
  SVar5.ptr_ = pcVar4;
  return SVar5;
}

Assistant:

StringPiece ProcessInfo::procname(const string& stat)
{
  StringPiece name;
  size_t lp = stat.find('(');
  size_t rp = stat.rfind(')');
  if (lp != string::npos && rp != string::npos && lp < rp)
  {
    name.set(stat.data()+lp+1, static_cast<int>(rp-lp-1));
  }
  return name;
}